

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

ON_Font * ON_Font::FontFromRichTextProperties
                    (ON_wString *rich_text_font_name,bool bBoldQuartetMember,
                    bool bItalicQuartetMember,bool bUnderlined,bool bStrikethrough)

{
  ON_wString *this;
  undefined1 auVar1 [16];
  Weight WVar2;
  ON_wString OVar3;
  bool bVar4;
  Weight font_weight;
  int iVar5;
  uint logfont_charset;
  wchar_t *pwVar6;
  ON_FontFaceQuartet *pOVar7;
  ON_Font *pOVar8;
  wchar_t *prefered_face_name;
  ON_Font *pOVar9;
  ON_Font *pOVar10;
  Member member;
  NameLocale NVar11;
  Weight WVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double linefeed_ratio;
  undefined1 auVar15 [16];
  ON_wString en_windows_logfont_name;
  ON_wString loc_windows_logfont_name;
  ON_wString en_family_name;
  ON_wString loc_family_name;
  ON_wString en_quartet_name;
  ON_wString loc_quartet_name;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  ON_wString local_178;
  ON_MemoryAllocationTracking disable_tracking;
  ON_FontFaceQuartet local_168;
  ON_FontFaceQuartet managed_substitute_quartet;
  ON_Font fake_font;
  ON_FontFaceQuartet installed_quartet;
  
  ON_wString::TrimLeftAndRight(rich_text_font_name,(wchar_t *)0x0);
  bVar4 = ON_wString::IsEmpty(rich_text_font_name);
  if (bVar4) {
    RichTextFontName(&fake_font);
    ON_wString::operator=(rich_text_font_name,(ON_wString *)&fake_font);
    ON_wString::~ON_wString((ON_wString *)&fake_font);
  }
  member = bItalicQuartetMember * '\x02' + Regular;
  if (bBoldQuartetMember) {
    member = bItalicQuartetMember * '\x02' + Bold;
  }
  ON_ManagedFonts::InstalledFonts();
  pwVar6 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
  pOVar7 = ON_FontList::QuartetFromQuartetName
                     (&installed_quartet,&ON_ManagedFonts::List.m_installed_fonts,pwVar6);
  auVar13._0_4_ =
       -(uint)((int)installed_quartet.m_italic == 0 && (int)installed_quartet.m_regular == 0);
  auVar13._4_4_ =
       -(uint)(installed_quartet.m_italic._4_4_ == 0 && installed_quartet.m_regular._4_4_ == 0);
  auVar13._8_4_ =
       -(uint)((int)installed_quartet.m_bold_italic == 0 && (int)installed_quartet.m_bold == 0);
  auVar13._12_4_ =
       -(uint)(installed_quartet.m_bold_italic._4_4_ == 0 && installed_quartet.m_bold._4_4_ == 0);
  iVar5 = movmskps((int)pOVar7,auVar13);
  if ((iVar5 != 0xf) &&
     (pOVar8 = ON_FontFaceQuartet::ClosestFace(&installed_quartet,member), pOVar8 != (ON_Font *)0x0)
     ) {
    pOVar8 = Internal_DecoratedFont(pOVar8,bUnderlined,bStrikethrough);
    goto LAB_0049a58e;
  }
  pwVar6 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
  pOVar7 = ON_FontList::QuartetFromQuartetName
                     (&managed_substitute_quartet,&ON_ManagedFonts::List.m_managed_fonts,pwVar6);
  auVar1._8_8_ = managed_substitute_quartet.m_bold;
  auVar1._0_8_ = managed_substitute_quartet.m_regular;
  auVar15._8_8_ = managed_substitute_quartet.m_bold_italic;
  auVar15._0_8_ = managed_substitute_quartet.m_italic;
  auVar15 = auVar15 | auVar1;
  linefeed_ratio = auVar15._0_8_;
  auVar14._0_4_ = -(uint)(auVar15._0_4_ == 0);
  auVar14._4_4_ = -(uint)(auVar15._4_4_ == 0);
  auVar14._8_4_ = -(uint)(auVar15._8_4_ == 0);
  auVar14._12_4_ = -(uint)(auVar15._12_4_ == 0);
  iVar5 = movmskps((int)pOVar7,auVar14);
  if ((iVar5 == 0xf) ||
     (pOVar8 = ON_FontFaceQuartet::Face(&managed_substitute_quartet,member),
     pOVar8 == (ON_Font *)0x0)) {
    ON_MemoryAllocationTracking::ON_MemoryAllocationTracking(&disable_tracking,false);
    ON_wString::ON_wString((ON_wString *)&fake_font,rich_text_font_name);
    ON_wString::operator=(rich_text_font_name,&ON_wString::EmptyString);
    pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&fake_font);
    ON_wString::ON_wString(&local_168.m_quartet_name,pwVar6);
    ON_wString::operator=(rich_text_font_name,&local_168.m_quartet_name);
    ON_wString::~ON_wString(&local_168.m_quartet_name);
    ON_wString::~ON_wString((ON_wString *)&fake_font);
    pwVar6 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
    pOVar8 = InstalledFontFromRichTextProperties(pwVar6,bBoldQuartetMember,bItalicQuartetMember);
    if (pOVar8 == (ON_Font *)0x0) {
      ON_ManagedFonts::InstalledFonts();
      pwVar6 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
      pOVar8 = ON_FontList::FromWindowsLogfontName(&ON_ManagedFonts::List.m_installed_fonts,pwVar6);
      if (pOVar8 != (ON_Font *)0x0) {
LAB_0049a513:
        InstalledFontQuartet((ON_FontFaceQuartet *)&fake_font,pOVar8);
        ON_FontFaceQuartet::operator=(&installed_quartet,(ON_FontFaceQuartet *)&fake_font);
        ON_wString::~ON_wString((ON_wString *)&fake_font);
        pOVar9 = ON_FontFaceQuartet::ClosestFace
                           (&installed_quartet,bBoldQuartetMember,bItalicQuartetMember);
        if (pOVar9 != (ON_Font *)0x0) {
          pOVar8 = pOVar9;
        }
        goto LAB_0049a55f;
      }
      ON_ManagedFonts::InstalledFonts();
      pwVar6 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
      pOVar8 = ON_FontList::FromPostScriptName(&ON_ManagedFonts::List.m_installed_fonts,pwVar6);
      if (pOVar8 != (ON_Font *)0x0) goto LAB_0049a513;
      ON_ManagedFonts::InstalledFonts();
      pwVar6 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
      ON_wString::ON_wString((ON_wString *)&fake_font,L"Regular");
      prefered_face_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&fake_font);
      pOVar8 = ON_FontList::FromFamilyName
                         (&ON_ManagedFonts::List.m_installed_fonts,pwVar6,prefered_face_name);
      ON_wString::~ON_wString((ON_wString *)&fake_font);
      if (pOVar8 != (ON_Font *)0x0) goto LAB_0049a513;
      ON_wString::ON_wString(&loc_quartet_name,rich_text_font_name);
      ON_wString::ON_wString(&en_quartet_name,rich_text_font_name);
      ON_wString::ON_wString(&loc_family_name,rich_text_font_name);
      ON_wString::ON_wString(&en_family_name,rich_text_font_name);
      ON_wString::ON_wString(&loc_windows_logfont_name,rich_text_font_name);
      ON_wString::ON_wString(&en_windows_logfont_name,rich_text_font_name);
      if ((managed_substitute_quartet.m_regular == (ON_Font *)0x0 &&
          managed_substitute_quartet.m_bold == (ON_Font *)0x0) &&
          managed_substitute_quartet.m_italic == (ON_Font *)0x0) {
        pOVar8 = managed_substitute_quartet.m_italic;
        if (managed_substitute_quartet.m_bold_italic != (ON_Font *)0x0) goto LAB_0049a63d;
        WVar12 = Bold;
        font_weight = Normal;
      }
      else {
        pOVar8 = managed_substitute_quartet.m_regular;
        if (managed_substitute_quartet.m_regular == (ON_Font *)0x0) {
          pOVar8 = managed_substitute_quartet.m_italic;
        }
LAB_0049a63d:
        pOVar9 = managed_substitute_quartet.m_bold;
        if (managed_substitute_quartet.m_bold == (ON_Font *)0x0) {
          pOVar9 = managed_substitute_quartet.m_bold_italic;
        }
        pOVar10 = pOVar8;
        if (pOVar8 == (ON_Font *)0x0) {
          pOVar10 = pOVar9;
        }
        if (pOVar10 != (ON_Font *)0x0) {
          NVar11 = (NameLocale)pOVar10;
          WindowsLogfontName((ON_Font *)(local_188 + 8),NVar11);
          WindowsLogfontName((ON_Font *)local_188,NVar11);
          Internal_SetFakeNamesFromExistingNames
                    ((ON_wString *)(local_188 + 8),(ON_wString *)local_188,&loc_quartet_name,
                     &en_quartet_name);
          ON_wString::~ON_wString((ON_wString *)local_188);
          ON_wString::~ON_wString((ON_wString *)(local_188 + 8));
          FamilyName((ON_Font *)(local_198 + 8),NVar11);
          FamilyName((ON_Font *)local_198,NVar11);
          Internal_SetFakeNamesFromExistingNames
                    ((ON_wString *)(local_198 + 8),(ON_wString *)local_198,&loc_family_name,
                     &en_family_name);
          ON_wString::~ON_wString((ON_wString *)local_198);
          ON_wString::~ON_wString((ON_wString *)(local_198 + 8));
          WindowsLogfontName((ON_Font *)(local_1a8 + 8),NVar11);
          WindowsLogfontName((ON_Font *)local_1a8,NVar11);
          Internal_SetFakeNamesFromExistingNames
                    ((ON_wString *)(local_1a8 + 8),(ON_wString *)local_1a8,&loc_windows_logfont_name
                     ,&en_windows_logfont_name);
          ON_wString::~ON_wString((ON_wString *)local_1a8);
          ON_wString::~ON_wString((ON_wString *)(local_1a8 + 8));
        }
        if (pOVar8 == (ON_Font *)0x0) {
          font_weight = Unset;
        }
        else {
          font_weight = pOVar8->m_font_weight;
        }
        if (pOVar9 == (ON_Font *)0x0) {
          WVar12 = Unset;
        }
        else {
          WVar12 = pOVar9->m_font_weight;
        }
        if ((font_weight == Unset) || (WVar12 != Unset)) {
          if ((font_weight == Unset) && (WVar12 != Unset)) {
            font_weight = Normal;
            if ((Normal < WVar12) || (font_weight = Thin, WVar12 < Light)) goto LAB_0049a807;
            font_weight = FontWeightFromUnsigned(WVar12 - 2);
          }
          WVar2 = Normal;
          if (font_weight != Unset) {
            WVar2 = font_weight;
          }
          font_weight = WVar2;
          if (WVar12 == Unset) {
            WVar12 = Bold;
          }
        }
        else {
          WVar12 = (Semibold < font_weight) * '\x02' + Bold;
        }
      }
LAB_0049a807:
      local_178.m_s = (wchar_t *)&Default;
      logfont_charset = (uint)Default.m_logfont_charset;
      ON_Font(&fake_font);
      pwVar6 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
      if (bBoldQuartetMember) {
        font_weight = WVar12;
      }
      SetFontCharacteristics
                (&fake_font,0.0,pwVar6,font_weight,bItalicQuartetMember + Upright,Medium,false,false
                 ,linefeed_ratio,logfont_charset);
      ON_wString::operator=(&fake_font.m_loc_family_name,&loc_family_name);
      ON_wString::operator=(&fake_font.m_en_family_name,&en_family_name);
      ON_wString::operator=(&fake_font.m_loc_windows_logfont_name,&loc_windows_logfont_name);
      ON_wString::operator=(&fake_font.m_en_windows_logfont_name,&en_windows_logfont_name);
      ON_FontFaceQuartet::MemberToString(&local_168,member);
      this = &fake_font.m_loc_face_name;
      ON_wString::operator=(this,&local_168.m_quartet_name);
      ON_wString::~ON_wString(&local_168.m_quartet_name);
      ON_wString::operator=(&fake_font.m_en_face_name,this);
      ON_wString::operator=(&fake_font.m_loc_postscript_name,&ON_wString::EmptyString);
      ON_wString::operator=(&fake_font.m_en_postscript_name,&ON_wString::EmptyString);
      fake_font.m_quartet_member = member;
      pOVar8 = GetManagedFont(&fake_font,false);
      if (pOVar8 != (ON_Font *)0x0) {
        NVar11 = (NameLocale)pOVar8;
        WindowsLogfontName((ON_Font *)(local_1b8 + 8),NVar11);
        WindowsLogfontName((ON_Font *)local_1b8,NVar11);
        Internal_SetFakeNamesFromExistingNames
                  ((ON_wString *)(local_1b8 + 8),(ON_wString *)local_1b8,&loc_quartet_name,
                   &en_quartet_name);
        ON_wString::~ON_wString((ON_wString *)local_1b8);
        ON_wString::~ON_wString((ON_wString *)(local_1b8 + 8));
        FamilyName((ON_Font *)(local_1c8 + 8),NVar11);
        FamilyName((ON_Font *)local_1c8,NVar11);
        Internal_SetFakeNamesFromExistingNames
                  ((ON_wString *)(local_1c8 + 8),(ON_wString *)local_1c8,&loc_family_name,
                   &en_family_name);
        ON_wString::~ON_wString((ON_wString *)local_1c8);
        ON_wString::~ON_wString((ON_wString *)(local_1c8 + 8));
        WindowsLogfontName((ON_Font *)(local_1d8 + 8),NVar11);
        WindowsLogfontName((ON_Font *)local_1d8,NVar11);
        Internal_SetFakeNamesFromExistingNames
                  ((ON_wString *)(local_1d8 + 8),(ON_wString *)local_1d8,&loc_windows_logfont_name,
                   &en_windows_logfont_name);
        ON_wString::~ON_wString((ON_wString *)local_1d8);
        ON_wString::~ON_wString((ON_wString *)(local_1d8 + 8));
        ON_wString::operator=(&fake_font.m_loc_family_name,&loc_family_name);
        ON_wString::operator=(&fake_font.m_en_family_name,&en_family_name);
        ON_FontFaceQuartet::MemberToString(&local_168,member);
        ON_wString::operator=(this,&local_168.m_quartet_name);
        ON_wString::~ON_wString(&local_168.m_quartet_name);
        ON_wString::operator=(&fake_font.m_en_face_name,this);
        ON_wString::operator=(&fake_font.m_loc_windows_logfont_name,&loc_windows_logfont_name);
        ON_wString::operator=(&fake_font.m_en_windows_logfont_name,&en_windows_logfont_name);
      }
      pOVar8 = GetManagedFont(&fake_font,true);
      OVar3.m_s = local_178.m_s;
      if ((pOVar8 == (ON_Font *)0x0) ||
         (bVar4 = IsInstalledFont(pOVar8), OVar3.m_s = (wchar_t *)pOVar8, bVar4)) {
        local_178.m_s = OVar3.m_s;
        pOVar8 = Internal_DecoratedFont((ON_Font *)local_178.m_s,bUnderlined,bStrikethrough);
      }
      else {
        pOVar9 = SubstituteFont(pOVar8);
        if (((pOVar9 == (ON_Font *)0x0) || (bVar4 = IsInstalledFont(pOVar9), !bVar4)) ||
           (member != pOVar9->m_quartet_member)) {
          InstalledFontQuartet(&local_168,&Default);
          pOVar9 = ON_FontFaceQuartet::ClosestFace(&local_168,member);
          ON_wString::~ON_wString(&local_168.m_quartet_name);
          if (pOVar9 == (ON_Font *)0x0) {
            pOVar9 = &Default;
          }
          pOVar8->m_managed_installed_font_and_bits = (ulong)pOVar9 | 2;
        }
        pOVar8 = Internal_DecoratedFont(pOVar8,bUnderlined,bStrikethrough);
      }
      ~ON_Font(&fake_font);
      ON_wString::~ON_wString(&en_windows_logfont_name);
      ON_wString::~ON_wString(&loc_windows_logfont_name);
      ON_wString::~ON_wString(&en_family_name);
      ON_wString::~ON_wString(&loc_family_name);
      ON_wString::~ON_wString(&en_quartet_name);
      ON_wString::~ON_wString(&loc_quartet_name);
    }
    else {
LAB_0049a55f:
      pOVar8 = Internal_DecoratedFont(pOVar8,bUnderlined,bStrikethrough);
    }
    ON_MemoryAllocationTracking::~ON_MemoryAllocationTracking(&disable_tracking);
  }
  else {
    pOVar8 = Internal_DecoratedFont(pOVar8,bUnderlined,bStrikethrough);
  }
  ON_wString::~ON_wString(&managed_substitute_quartet.m_quartet_name);
LAB_0049a58e:
  ON_wString::~ON_wString(&installed_quartet.m_quartet_name);
  return pOVar8;
}

Assistant:

const ON_Font* ON_Font::FontFromRichTextProperties(
  ON_wString rich_text_font_name,
  bool bBoldQuartetMember,
  bool bItalicQuartetMember,
  bool bUnderlined,
  bool bStrikethrough
)
{
  rich_text_font_name.TrimLeftAndRight();
  if (rich_text_font_name.IsEmpty())
    rich_text_font_name = ON_Font::Default.RichTextFontName();

  const ON_FontFaceQuartet::Member rich_text_quartet_face = ON_FontFaceQuartet::MemberFromBoldAndItalic(bBoldQuartetMember, bItalicQuartetMember);

  ON_FontFaceQuartet installed_quartet = ON_ManagedFonts::InstalledFonts().QuartetFromQuartetName(rich_text_font_name);
  if ( installed_quartet.IsNotEmpty() )
  {
    // Installed font quartets use ClosestFace() because we know all the faces 
    // the real font contains.
    // If you don't get what you want, your asking for something that does not exist.
    // You may need to fix some user interface to not offer the choice that led you here.
    const ON_Font* installed_font = installed_quartet.ClosestFace(rich_text_quartet_face); // DO NOT CHANGE TO Face()
    if (nullptr != installed_font)
      return installed_font->Internal_DecoratedFont( bUnderlined, bStrikethrough);
  }

  const ON_FontFaceQuartet managed_substitute_quartet = ON_ManagedFonts::ManagedFonts().QuartetFromQuartetName(rich_text_font_name);
  if (managed_substitute_quartet.IsNotEmpty())
  {
    // Missing font quartets use Face() because we don't know what the real font quartet looks like.
    const ON_Font* managed_quartet_face = managed_substitute_quartet.Face(rich_text_quartet_face); // DO NOT CHANGE TO ClosestFace()
    if (nullptr != managed_quartet_face)
      return managed_quartet_face->Internal_DecoratedFont(bUnderlined, bStrikethrough); // this missing face has already been added to the quartet
  }

  // We will need to make a new managed font and put it in  a reasonable managed quartet.

  // All memory allocated for managed fonts is permanent app workspace memory.
  ON_MemoryAllocationTracking disable_tracking(false);
  {
    // convert the name to untracked memory so it doesn't look like a leak
    const ON_wString local_str(rich_text_font_name);
    rich_text_font_name = ON_wString::EmptyString;
    rich_text_font_name = ON_wString(static_cast<const wchar_t*>(local_str));
  }

  const ON_Font* installed_font = nullptr;
  installed_font = ON_Font::InstalledFontFromRichTextProperties(rich_text_font_name, bBoldQuartetMember, bItalicQuartetMember);
  if (nullptr == installed_font)
  {
#if defined(ON_RUNTIME_APPLE)
    if (nullptr == installed_font)
      installed_font = ON_Font::InstalledFontList().FromPostScriptName(rich_text_font_name);
#endif
    if (nullptr == installed_font)
      installed_font = ON_Font::InstalledFontList().FromWindowsLogfontName(rich_text_font_name);
#if !defined(ON_RUNTIME_APPLE)
    if (nullptr == installed_font)
      installed_font = ON_Font::InstalledFontList().FromPostScriptName(rich_text_font_name);
#endif
    if (nullptr == installed_font)
      installed_font = ON_Font::InstalledFontList().FromFamilyName(rich_text_font_name, ON_FontFaceQuartet::MemberToString(ON_FontFaceQuartet::Member::Regular) );
    if (nullptr != installed_font)
    {
      installed_quartet = installed_font->InstalledFontQuartet(); // only look at installed quartet!
      const ON_Font* installed_rtfface = installed_quartet.ClosestFace(bBoldQuartetMember, bItalicQuartetMember);
      if (nullptr != installed_rtfface)
        installed_font = installed_rtfface;
    }
  }

  if (nullptr != installed_font)
  {
    // The font is installed on this device.
    return installed_font->Internal_DecoratedFont(bUnderlined, bStrikethrough);
  }


  ON_wString loc_quartet_name = rich_text_font_name;
  ON_wString en_quartet_name = rich_text_font_name;

  ON_wString loc_family_name = rich_text_font_name;
  ON_wString en_family_name = rich_text_font_name;

  ON_wString loc_windows_logfont_name = rich_text_font_name;
  ON_wString en_windows_logfont_name = rich_text_font_name;

  ON_Font::Weight fake_normal_weight = ON_Font::Weight::Unset;
  ON_Font::Weight fake_bold_weight = ON_Font::Weight::Unset;

  if (managed_substitute_quartet.IsNotEmpty())
  {
    // get known names and guesses at weights from the existing parts of the quartet.

    const ON_Font* normal_weight_font = managed_substitute_quartet.Face(ON_FontFaceQuartet::Member::Regular);
    if ( nullptr == normal_weight_font)
      normal_weight_font = managed_substitute_quartet.Face(ON_FontFaceQuartet::Member::Italic);

    const ON_Font* bold_weight_font = managed_substitute_quartet.Face(ON_FontFaceQuartet::Member::Bold);
    if (nullptr == bold_weight_font)
      bold_weight_font = managed_substitute_quartet.Face(ON_FontFaceQuartet::Member::BoldItalic);

    const ON_Font* names_font = (nullptr != normal_weight_font) ? normal_weight_font : bold_weight_font;

    if (nullptr != names_font)
    {
      Internal_SetFakeNamesFromExistingNames(
        names_font->QuartetName(ON_Font::NameLocale::Localized),
        names_font->QuartetName(ON_Font::NameLocale::English),
        loc_quartet_name,
        en_quartet_name
      );

      Internal_SetFakeNamesFromExistingNames(
        names_font->FamilyName(ON_Font::NameLocale::Localized),
        names_font->FamilyName(ON_Font::NameLocale::English),
        loc_family_name,
        en_family_name
      );

      Internal_SetFakeNamesFromExistingNames(
        names_font->WindowsLogfontName(ON_Font::NameLocale::Localized),
        names_font->WindowsLogfontName(ON_Font::NameLocale::English),
        loc_windows_logfont_name,
        en_windows_logfont_name
      );
    }

    if (nullptr != normal_weight_font)
      fake_normal_weight = normal_weight_font->FontWeight();
    if (nullptr != bold_weight_font)
      fake_bold_weight = bold_weight_font->FontWeight();

    const unsigned normal_unsigned = static_cast<unsigned>(fake_normal_weight);
    const unsigned bold_unsigned = static_cast<unsigned>(fake_bold_weight);
    const unsigned default_normal_unsigned = static_cast<unsigned>(ON_Font::Weight::Normal);
    const unsigned default_bold_unsigned = static_cast<unsigned>(ON_Font::Weight::Bold);
    const unsigned min_weight = static_cast<unsigned>(ON_Font::Weight::Thin);
    const unsigned max_weight = static_cast<unsigned>(ON_Font::Weight::Heavy);

    if (ON_Font::Weight::Unset != fake_normal_weight && ON_Font::Weight::Unset == fake_bold_weight)
    {
      // have to guess at a bold weight
      fake_bold_weight
        = normal_unsigned < default_bold_unsigned
        ? ON_Font::Weight::Bold
        : ((normal_unsigned + 2 <= max_weight) ? ON_Font::FontWeightFromUnsigned(normal_unsigned + 2) : ON_Font::Weight::Heavy)
        ;
    }

    if (ON_Font::Weight::Unset != fake_bold_weight && ON_Font::Weight::Unset == fake_normal_weight)
    {
      // have to guess at a normal weight
      fake_normal_weight
        = bold_unsigned > default_normal_unsigned
        ? ON_Font::Weight::Normal
        : ((min_weight + 2 <= bold_unsigned) ? ON_Font::FontWeightFromUnsigned(bold_unsigned - 2) : ON_Font::Weight::Thin)
        ;
    }
  }

  if (ON_Font::Weight::Unset == fake_normal_weight)
    fake_normal_weight = ON_Font::Weight::Normal;
  if (ON_Font::Weight::Unset == fake_bold_weight)
    fake_bold_weight = ON_Font::Weight::Bold;

  const double point_size = 0.0;
  const unsigned int logfont_charset = ON_Font::Default.LogfontCharSet();

  ON_Font fake_font;
  fake_font.SetFontCharacteristics(
    point_size,
    rich_text_font_name,
    bBoldQuartetMember ? fake_bold_weight : fake_normal_weight,
    bItalicQuartetMember ? ON_Font::Style::Italic : ON_Font::Style::Upright,
    ON_Font::Stretch::Medium,
    false, // DO NOT PASS bUnderlined here
    false, // DO NOT PASS bStrikethrough here
    ON_FontMetrics::DefaultLineFeedRatio,
    logfont_charset
  );

  fake_font.m_loc_family_name = loc_family_name;
  fake_font.m_en_family_name = en_family_name;

  fake_font.m_loc_windows_logfont_name = loc_windows_logfont_name;
  fake_font.m_en_windows_logfont_name = en_windows_logfont_name;

  // There is no reliable way to get the face name  - we fake it by using the quartet face name below
  fake_font.m_loc_face_name = ON_FontFaceQuartet::MemberToString(rich_text_quartet_face);
  fake_font.m_en_face_name = fake_font.m_loc_face_name;

  // There is no reliable way to get the PostScript name 
  fake_font.m_loc_postscript_name = ON_wString::EmptyString;
  fake_font.m_en_postscript_name = ON_wString::EmptyString;

  fake_font.m_quartet_member = rich_text_quartet_face;

  // When reading 3dm files created on a device with other fonts
  // Frequently a managed font is added when a dimstyle is read.
  // Later on annotation objects are read and rich text requests
  // regular/bold/italic/bold-italic faces from the dimstyle font's 
  // quartet. When existing_managed_font is not nullptr, we need
  // to create a fake quartet containing that font.
  // When existing_managed_font is nullptr, we need to create
  // a fake quartet based on only the rtf_font_name.
  // (Sure wish we had not dumped the V5 font table, sigh.)
  const ON_Font* existing_managed_font = ON_Font::GetManagedFont(fake_font, false);

  if (nullptr != existing_managed_font)
  {
    Internal_SetFakeNamesFromExistingNames(
      existing_managed_font->QuartetName(ON_Font::NameLocale::Localized),
      existing_managed_font->QuartetName(ON_Font::NameLocale::English),
      loc_quartet_name,
      en_quartet_name
    );

    Internal_SetFakeNamesFromExistingNames(
      existing_managed_font->FamilyName(ON_Font::NameLocale::Localized),
      existing_managed_font->FamilyName(ON_Font::NameLocale::English),
      loc_family_name,
      en_family_name
    );

    Internal_SetFakeNamesFromExistingNames(
      existing_managed_font->WindowsLogfontName(ON_Font::NameLocale::Localized),
      existing_managed_font->WindowsLogfontName(ON_Font::NameLocale::English),
      loc_windows_logfont_name,
      en_windows_logfont_name
    );

    fake_font.m_loc_family_name = loc_family_name;
    fake_font.m_en_family_name = en_family_name;

    fake_font.m_loc_face_name = ON_FontFaceQuartet::MemberToString(rich_text_quartet_face);
    fake_font.m_en_face_name = fake_font.m_loc_face_name;

    fake_font.m_loc_windows_logfont_name = loc_windows_logfont_name;
    fake_font.m_en_windows_logfont_name = en_windows_logfont_name;
  }

  // Need to make a fake rich text quartet of managed fonts so rich text 
  // bold and italic faces work as expected.

  // creating a managed fake font resets the fake quartets
  // and this fake will get added to the quartets next time
  // they are needed.
  const ON_Font* managed_fake_font = ON_Font::GetManagedFont(fake_font, true);

  if (nullptr == managed_fake_font)
  {
    // should never happen
    return ON_Font::Default.Internal_DecoratedFont(bUnderlined, bStrikethrough);
  }

  if (managed_fake_font->IsInstalledFont())
  {
    return managed_fake_font->Internal_DecoratedFont(bUnderlined, bStrikethrough);
  }

  // set installed substitute used to render the missing font
  const ON_Font* installed_substitute = managed_fake_font->SubstituteFont();
  if (nullptr == installed_substitute || false == installed_substitute->IsInstalledFont() || rich_text_quartet_face != installed_substitute->m_quartet_member)
  {
    // We have better information to select the correct substitute than inside the ON_Font::GetManagedFont(fake_font, true) call above.
    // Use this information to specify a better substitute font.
    installed_substitute = ON_Font::Default.InstalledFontQuartet().ClosestFace(rich_text_quartet_face); // only look at installed quartet
    if (nullptr == installed_substitute)
      installed_substitute = &ON_Font::Default;
    const bool bInstalledFontIsASubstitute = true;
    ON_Font::Internal_SetManagedFontInstalledFont(
      managed_fake_font,
      installed_substitute,
      bInstalledFontIsASubstitute
    );
  }

  return managed_fake_font->Internal_DecoratedFont(bUnderlined, bStrikethrough);
}